

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall SynthWidget::setEmuModeText(SynthWidget *this)

{
  QLabel *pQVar1;
  ROMInfo *pRVar2;
  char *ch;
  QString emuMode;
  ROMImage *controlROMImage;
  ROMImage *pcmROMImage;
  QArrayDataPointer<char16_t> local_48;
  ROMImage *local_30;
  QArrayDataPointer<char16_t> local_28;
  ROMImage *local_10;
  
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  local_30 = (ROMImage *)0x0;
  local_10 = (ROMImage *)0x0;
  SynthRoute::getROMImages(this->synthRoute,&local_30,&local_10);
  if (local_30 == (ROMImage *)0x0) {
    ch = "Unknown";
  }
  else {
    pRVar2 = MT32Emu::ROMImage::getROMInfo(local_30);
    ch = pRVar2->description;
  }
  QString::operator=((QString *)&local_48,ch);
  pQVar1 = (this->ui->super_Ui_SynthWidget).synthEmuModeLabel;
  operator+((QString *)&local_28,"Emulation Mode: ",(QString *)&local_48);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  return;
}

Assistant:

void SynthWidget::setEmuModeText() {
	QString emuMode;
	const MT32Emu::ROMImage *controlROMImage = NULL;
	const MT32Emu::ROMImage *pcmROMImage = NULL;
	synthRoute->getROMImages(controlROMImage, pcmROMImage);
	emuMode = controlROMImage == NULL ? "Unknown" : controlROMImage->getROMInfo()->description;
	ui->synthEmuModeLabel->setText("Emulation Mode: " + emuMode);
}